

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

void wasmbox_free(void *ptr)

{
  freed = freed + *(int *)((long)ptr + -4);
  free((void *)((long)ptr + -4));
  return;
}

Assistant:

void wasmbox_free(void *ptr) {
  wasm_s32_t *mem = &((wasm_s32_t *) ptr)[-1];
  freed += mem[0];
#ifdef WASMBOX_ALLOCATOR_DEBUG_TRACE
  fprintf(stdout, "F: %p %d\n", mem, mem[0]);
#endif
  free(mem);
}